

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fout.cpp
# Opt level: O2

void __thiscall spatial_region::compute_rho(spatial_region *this)

{
  cellj *pcVar1;
  uint uVar2;
  uint uVar3;
  cellj ***pppcVar4;
  cellj *pcVar5;
  pointer pfVar6;
  particle *p;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int j;
  long lVar11;
  long lVar12;
  int k;
  long lVar13;
  ulong uVar14;
  particle **pppVar15;
  int i;
  
  uVar8 = this->nx;
  uVar7 = this->ny;
  for (uVar9 = 0; uVar9 != (~((int)uVar8 >> 0x1f) & uVar8); uVar9 = uVar9 + 1) {
    uVar2 = this->nz;
    for (uVar10 = 0; uVar10 != (~((int)uVar7 >> 0x1f) & uVar7); uVar10 = uVar10 + 1) {
      uVar3 = this->n_ion_populations;
      pppcVar4 = (this->cj).p._M_t.super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>
                 ._M_t.super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>.
                 super__Head_base<0UL,_cellj_***,_false>._M_head_impl;
      for (uVar14 = 0; uVar14 != (~((int)uVar2 >> 0x1f) & uVar2); uVar14 = uVar14 + 1) {
        pcVar5 = pppcVar4[uVar9][uVar10];
        pcVar1 = pcVar5 + uVar14;
        pcVar1->jx = 0.0;
        pcVar1->jy = 0.0;
        pcVar5[uVar14].jz = 0.0;
        pfVar6 = (this->irho).super__Vector_base<field3d<double>,_std::allocator<field3d<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        for (lVar11 = 0; (ulong)(~((int)uVar3 >> 0x1f) & uVar3) * 0x28 - lVar11 != 0;
            lVar11 = lVar11 + 0x28) {
          *(undefined8 *)
           (*(long *)(*(long *)(*(long *)((long)&(pfVar6->p)._M_t.
                                                 super___uniq_ptr_impl<double_**,_std::default_delete<double_**[]>_>
                                         + lVar11) + uVar9 * 8) + uVar10 * 8) + uVar14 * 8) = 0;
        }
      }
    }
  }
  for (lVar11 = 0; lVar11 < (int)uVar8; lVar11 = lVar11 + 1) {
    for (lVar12 = 0; lVar12 < (int)uVar7; lVar12 = lVar12 + 1) {
      for (lVar13 = 0; lVar13 < this->nz; lVar13 = lVar13 + 1) {
        pppVar15 = &(this->cp).p._M_t.
                    super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                    super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                    super__Head_base<0UL,_cellp_***,_false>._M_head_impl[lVar11][lVar12][lVar13].pl.
                    start;
        while (p = *pppVar15, p != (particle *)0x0) {
          rhodeposition(this,p);
          pppVar15 = &p->next;
        }
      }
      uVar7 = this->ny;
    }
    uVar8 = this->nx;
  }
  return;
}

Assistant:

void spatial_region::compute_rho()
{
    particle* current;
    for(int i=0;i<nx;i++)
    {
        for(int j=0;j<ny;j++)
        {
            for(int k=0;k<nz;k++)
            {
                cj[i][j][k].jx = 0;
                cj[i][j][k].jy = 0;
                cj[i][j][k].jz = 0;
                for (int n=0;n<n_ion_populations;n++)
                    irho[n][i][j][k] = 0;
            }
        }
    }
    for(int i=0;i<nx;i++)
    {
        for(int j=0;j<ny;j++)
        {
            for(int k=0;k<nz;k++)
            {
                current = cp[i][j][k].pl.start;
                while(current!=0)
                {
                    rhodeposition(*current);
                    current = current->next;
                }
            }
        }
    }
}